

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  char cVar1;
  xpath_variable *pxVar2;
  xpath_ast_node *pxVar3;
  xpath_node *pxVar4;
  xpath_node *pxVar5;
  type_t type;
  xml_node xVar6;
  long lVar7;
  xpath_memory_block *pxVar8;
  bool bVar9;
  xpath_allocator_capture cr;
  xpath_stack swapped_stack;
  xpath_node_set_raw rs;
  xpath_node_set_raw local_80;
  xpath_stack local_60;
  xpath_node_set_raw local_50;
  
  cVar1 = this->_type;
  switch(cVar1) {
  case '\x0f':
    local_80._0_8_ = stack->temp;
    local_80._begin = (xpath_node *)((xml_node_struct *)local_80._0_8_)->header;
    local_80._end = (xpath_node *)((xml_node_struct *)local_80._0_8_)->name;
    local_80._eos = (xpath_node *)((xml_node_struct *)local_80._0_8_)->value;
    local_60.temp = stack->result;
    local_60.result = (xpath_allocator *)local_80._0_8_;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set(&local_50,this->_right,c,&local_60,eval);
    __return_storage_ptr__->_type = type_unsorted;
    xpath_node_set_raw::append(__return_storage_ptr__,local_50._begin,local_50._end,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_80);
    break;
  case '\x10':
  case '\x12':
  case '\x13':
  case '\x15':
  case '\x16':
  case '\x17':
switchD_001798f2_caseD_10:
    __assert_fail("false && \"Wrong expression for return type node set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x2aa3,
                  "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                 );
  case '\x11':
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,(uint)(this->_test == '\x03') * 2);
    type = __return_storage_ptr__->_type;
    if (this->_test != '\x01') {
      type = xpath_sort(__return_storage_ptr__->_begin,__return_storage_ptr__->_end,type,false);
      __return_storage_ptr__->_type = type;
    }
    bVar9 = eval == nodeset_eval_any;
    if (type == type_sorted) {
      bVar9 = eval != nodeset_eval_all;
    }
    apply_predicate(this,__return_storage_ptr__,0,stack,bVar9);
    break;
  case '\x14':
    pxVar2 = (this->_data).variable;
    if (pxVar2->_type != (int)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a92,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    if (this->_rettype != '\x01') goto switchD_001798f2_caseD_10;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    __return_storage_ptr__->_type = pxVar2[1]._type;
    xpath_node_set_raw::append
              (__return_storage_ptr__,(xpath_node *)pxVar2[2]._next,*(xpath_node **)(pxVar2 + 3),
               stack->result);
    break;
  case '\x18':
switchD_001798f2_caseD_18:
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    break;
  default:
    if (cVar1 != '8') {
      if (cVar1 == '9') {
        if (this->_right != (xpath_ast_node *)0x0) {
          __assert_fail("!_right",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x2a84,
                        "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                       );
        }
        __return_storage_ptr__->_begin = (xpath_node *)0x0;
        __return_storage_ptr__->_end = (xpath_node *)0x0;
        __return_storage_ptr__->_eos = (xpath_node *)0x0;
        __return_storage_ptr__->_type = type_sorted;
        xVar6 = xpath_node::node(&c->n);
        if (xVar6._root == (xml_node_struct *)0x0) {
          if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
            return __return_storage_ptr__;
          }
          local_60.result = (xpath_allocator *)xpath_node::parent(&c->n);
        }
        else {
          local_60.result = (xpath_allocator *)xpath_node::node(&c->n);
        }
        local_50._0_8_ = xml_node::root((xml_node *)&local_60);
        xpath_node::xpath_node((xpath_node *)&local_80,(xml_node *)&local_50);
        xpath_node_set_raw::push_back(__return_storage_ptr__,(xpath_node *)&local_80,stack->result);
        return __return_storage_ptr__;
      }
      goto switchD_001798f2_caseD_10;
    }
    switch(this->_axis) {
    case '\0':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval == nodeset_eval_any;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted_reverse;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
LAB_0017a441:
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,0,stack,eval);
        }
      }
      else {
        eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
        for (pxVar8 = (xpath_memory_block *)local_80._begin;
            pxVar8 != (xpath_memory_block *)local_80._end;
            pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
          lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
          if (lVar7 != 0) {
            __return_storage_ptr__->_type = type_unsorted;
          }
          step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                    (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
          if (this->_right != (xpath_ast_node *)0x0) {
            apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
          }
        }
      }
      break;
    case '\x01':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval == nodeset_eval_any;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted_reverse;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\x02':
      bVar9 = true;
      if (this->_test != '\x01') {
        pxVar3 = this->_right;
        if (pxVar3 == (xpath_ast_node *)0x0) {
          bVar9 = eval != nodeset_eval_all;
        }
        else if (pxVar3->_next == (xpath_ast_node *)0x0) {
          bVar9 = pxVar3->_test == '\x03';
        }
        else {
          bVar9 = false;
        }
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left != (xpath_ast_node *)0x0) {
        eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
        for (pxVar8 = (xpath_memory_block *)local_80._begin;
            pxVar8 != (xpath_memory_block *)local_80._end;
            pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
          lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
          if (lVar7 != 0) {
            __return_storage_ptr__->_type = type_unsorted;
          }
          step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                    (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
          if (this->_right != (xpath_ast_node *)0x0) {
            apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
          }
        }
        return __return_storage_ptr__;
      }
      step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                (this,__return_storage_ptr__,c,stack->result,bVar9);
      goto LAB_0017a534;
    case '\x03':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval != nodeset_eval_all;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left != (xpath_ast_node *)0x0) {
        eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
        for (pxVar8 = (xpath_memory_block *)local_80._begin;
            pxVar8 != (xpath_memory_block *)local_80._end;
            pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
          lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
          if (lVar7 != 0) {
            __return_storage_ptr__->_type = type_unsorted;
          }
          step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                    (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
          if (this->_right != (xpath_ast_node *)0x0) {
            apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
          }
        }
        return __return_storage_ptr__;
      }
      step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                (this,__return_storage_ptr__,c,stack->result,bVar9);
      goto LAB_0017a534;
    case '\x04':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval != nodeset_eval_all;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\x05':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval != nodeset_eval_all;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\x06':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval != nodeset_eval_all;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\a':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval != nodeset_eval_all;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\b':
      goto switchD_001798f2_caseD_18;
    case '\t':
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                  (this,__return_storage_ptr__,c,stack->result);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\n':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval == nodeset_eval_any;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted_reverse;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\v':
      pxVar3 = this->_right;
      if (pxVar3 == (xpath_ast_node *)0x0) {
        bVar9 = eval == nodeset_eval_any;
      }
      else if (pxVar3->_next == (xpath_ast_node *)0x0) {
        bVar9 = pxVar3->_test == '\x03';
      }
      else {
        bVar9 = false;
      }
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted_reverse;
      if (this->_left == (xpath_ast_node *)0x0) {
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                  (this,__return_storage_ptr__,c,stack->result,bVar9);
        goto LAB_0017a441;
      }
      eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
      for (pxVar8 = (xpath_memory_block *)local_80._begin;
          pxVar8 != (xpath_memory_block *)local_80._end;
          pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
        lVar7 = (long)__return_storage_ptr__->_end - (long)__return_storage_ptr__->_begin;
        if (lVar7 != 0) {
          __return_storage_ptr__->_type = type_unsorted;
        }
        step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                  (this,__return_storage_ptr__,pxVar8,stack->result,bVar9);
        if (this->_right != (xpath_ast_node *)0x0) {
          apply_predicates(this,__return_storage_ptr__,lVar7 >> 4,stack,eval);
        }
      }
      break;
    case '\f':
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = type_sorted;
      if (this->_left != (xpath_ast_node *)0x0) {
        eval_node_set(&local_80,this->_left,c,stack,nodeset_eval_all);
        __return_storage_ptr__->_type = local_80._type;
        for (pxVar8 = (xpath_memory_block *)local_80._begin;
            pxVar8 != (xpath_memory_block *)local_80._end;
            pxVar8 = (xpath_memory_block *)&pxVar8->field_2) {
          pxVar4 = __return_storage_ptr__->_begin;
          pxVar5 = __return_storage_ptr__->_end;
          step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                    (this,__return_storage_ptr__,pxVar8,stack->result);
          if (this->_right != (xpath_ast_node *)0x0) {
            apply_predicates(this,__return_storage_ptr__,(long)pxVar5 - (long)pxVar4 >> 4,stack,eval
                            );
          }
        }
        return __return_storage_ptr__;
      }
      step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                (this,__return_storage_ptr__,c,stack->result);
LAB_0017a534:
      if (this->_right == (xpath_ast_node *)0x0) {
        return __return_storage_ptr__;
      }
      apply_predicates(this,__return_storage_ptr__,0,stack,eval);
      return __return_storage_ptr__;
    default:
      __assert_fail("false && \"Unknown axis\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a7d,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    if (__return_storage_ptr__->_type == type_unsorted) {
      xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}